

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O2

bool embree::operator==(Token *a,Token *b)

{
  __type _Var1;
  bool bVar2;
  
  if (a->ty == b->ty) {
    switch(a->ty) {
    case TY_CHAR:
      bVar2 = (a->field_1).c == (b->field_1).c;
      break;
    case TY_INT:
      bVar2 = (a->field_1).i == (b->field_1).i;
      break;
    case TY_FLOAT:
      return (bool)(-((b->field_1).f == (a->field_1).f) & 1);
    case TY_IDENTIFIER:
    case TY_STRING:
    case TY_SYMBOL:
      _Var1 = std::operator==(&a->str,&b->str);
      return _Var1;
    default:
      return true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool operator==(const Token& a, const Token& b)
    {
      if (a.ty != b.ty) return false;
      if (a.ty == TY_CHAR) return a.c == b.c;
      if (a.ty == TY_INT) return a.i == b.i;
      if (a.ty == TY_FLOAT) return a.f == b.f;
      if (a.ty == TY_IDENTIFIER) return a.str == b.str;
      if (a.ty == TY_STRING) return a.str == b.str;
      if (a.ty == TY_SYMBOL) return a.str == b.str;
      return true;
    }